

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::texcoord3h> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord3h>
          (optional<tinyusdz::value::texcoord3h> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::texcoord3h> local_20;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<tinyusdz::value::texcoord3h>(&local_20,&this->_var);
  nonstd::optional_lite::optional<tinyusdz::value::texcoord3h>::
  optional<tinyusdz::value::texcoord3h,_0>(__return_storage_ptr__,&local_20);
  nonstd::optional_lite::optional<tinyusdz::value::texcoord3h>::~optional(&local_20);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }